

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBufferMapTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles3::Functional::BufferPartialMapWriteCase::iterate(BufferPartialMapWriteCase *this)

{
  CallLogWrapper *this_00;
  deUint32 seed;
  deUint32 buffer;
  GLenum GVar1;
  int iVar2;
  void *__dest;
  TestError *this_01;
  char *description;
  BufferVerifier verifier;
  ReferenceBuffer refBuf;
  
  seed = deStringHash((this->super_BufferCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p
                     );
  refBuf.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  refBuf.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  refBuf.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  deqp::gls::BufferTestUtil::BufferVerifier::BufferVerifier
            (&verifier,(this->super_BufferCase).m_renderCtx,
             ((this->super_BufferCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
             this->m_verify);
  deqp::gls::BufferTestUtil::ReferenceBuffer::setSize(&refBuf,this->m_bufferSize);
  deqp::gls::BufferTestUtil::fillWithRandomBytes
            (refBuf.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_start,this->m_bufferSize,seed);
  buffer = deqp::gls::BufferTestUtil::BufferCase::genBuffer(&this->super_BufferCase);
  this_00 = &(this->super_BufferCase).super_CallLogWrapper;
  glu::CallLogWrapper::glBindBuffer(this_00,this->m_bufferTarget,buffer);
  glu::CallLogWrapper::glBufferData
            (this_00,this->m_bufferTarget,(long)this->m_bufferSize,
             refBuf.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_start,this->m_usage);
  deqp::gls::BufferTestUtil::fillWithRandomBytes
            (refBuf.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_start + this->m_mapOffset,this->m_mapSize,seed & 0xabcdef);
  __dest = glu::CallLogWrapper::glMapBufferRange
                     (this_00,this->m_bufferTarget,(long)this->m_mapOffset,(long)this->m_mapSize,2);
  GVar1 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar1,"glMapBufferRange",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBufferMapTests.cpp"
                  ,0xbc);
  if (__dest != (void *)0x0) {
    memcpy(__dest,refBuf.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start + this->m_mapOffset,(long)this->m_mapSize
          );
    glu::CallLogWrapper::glUnmapBuffer(this_00,this->m_bufferTarget);
    GVar1 = glu::CallLogWrapper::glGetError(this_00);
    glu::checkError(GVar1,"glUnmapBuffer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBufferMapTests.cpp"
                    ,0xc1);
    iVar2 = deqp::gls::BufferTestUtil::BufferVerifier::verify
                      (&verifier,(EVP_PKEY_CTX *)(ulong)buffer,
                       refBuf.m_data.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start,0,(uchar *)(ulong)(uint)this->m_bufferSize,
                       (ulong)this->m_bufferTarget);
    deqp::gls::BufferTestUtil::BufferCase::deleteBuffer(&this->super_BufferCase,buffer);
    description = "Buffer verification failed";
    if ((byte)iVar2 != 0) {
      description = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_BufferCase).super_TestCase.super_TestNode.m_testCtx,
               (uint)(byte)((byte)iVar2 ^ 1),description);
    deqp::gls::BufferTestUtil::BufferVerifier::~BufferVerifier(&verifier);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&refBuf);
    return STOP;
  }
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,(char *)0x0,"ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBufferMapTests.cpp"
             ,0xbd);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

IterateResult iterate (void)
	{
		deUint32		dataSeed	= deStringHash(getName());
		ReferenceBuffer	refBuf;
		BufferVerifier	verifier	(m_renderCtx, m_testCtx.getLog(), m_verify);

		// Setup reference data.
		refBuf.setSize(m_bufferSize);
		fillWithRandomBytes(refBuf.getPtr(), m_bufferSize, dataSeed);

		deUint32 buf = genBuffer();
		glBindBuffer(m_bufferTarget, buf);
		glBufferData(m_bufferTarget, m_bufferSize, refBuf.getPtr(), m_usage);

		// Do reference map.
		fillWithRandomBytes(refBuf.getPtr(m_mapOffset), m_mapSize, dataSeed&0xabcdef);

		void* ptr = glMapBufferRange(m_bufferTarget, m_mapOffset, m_mapSize, GL_MAP_WRITE_BIT);
		GLU_CHECK_MSG("glMapBufferRange");
		TCU_CHECK(ptr);

		deMemcpy(ptr, refBuf.getPtr(m_mapOffset), m_mapSize);
		glUnmapBuffer(m_bufferTarget);
		GLU_CHECK_MSG("glUnmapBuffer");

		bool isOk = verifier.verify(buf, refBuf.getPtr(), 0, m_bufferSize, m_bufferTarget);
		deleteBuffer(buf);

		m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
								isOk ? "Pass"				: "Buffer verification failed");
		return STOP;
	}